

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O3

void __thiscall TimeAlloc::~TimeAlloc(TimeAlloc *this)

{
  ostream *poVar1;
  long *plVar2;
  
  time((time_t *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time, ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cnt, ",5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,globalCnt);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

~TimeAlloc()
	{
		time_t endTime = time(NULL);
		cout << "time, " << (unsigned int)(endTime - m_startTime) << endl;
		cout << "cnt, " << globalCnt << endl;
	}